

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<common_chat_msg> __l;
  initializer_list<common_chat_tool> __l_00;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  int in_EDI;
  exception *e;
  string format;
  value_type name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  common_chat_templates_ptr tmpls;
  string path;
  int i;
  common_chat_msg msg;
  common_chat_templates_inputs inputs;
  common_chat_msg *in_stack_fffffffffffffae0;
  common_chat_templates *in_stack_fffffffffffffae8;
  common_chat_msg *in_stack_fffffffffffffaf0;
  iterator in_stack_fffffffffffffaf8;
  common_chat_tool *in_stack_fffffffffffffb00;
  ostream *in_stack_fffffffffffffb10;
  common_chat_msg *in_stack_fffffffffffffb18;
  common_chat_msg *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb78;
  common_chat_format format_00;
  common_chat_msg_content_part **local_450;
  undefined1 ***local_438;
  string local_388 [32];
  string local_368 [39];
  undefined1 local_341 [33];
  undefined1 local_320 [40];
  string local_2f8 [36];
  int local_2d4;
  common_chat_msg_content_part *local_2d0;
  common_chat_msg_content_part local_2c8;
  common_chat_msg_content_part *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_260;
  undefined1 **local_250 [26];
  undefined8 **local_180;
  undefined8 local_178;
  string local_160 [32];
  string local_140 [312];
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    test_msgs_oaicompat_json_conversion();
    test_tools_oaicompat_json_conversion();
    test_template_output_parsers();
    poVar3 = std::operator<<((ostream *)&std::cout,"\n[chat] All tests passed!");
    std::operator<<(poVar3,'\n');
  }
  else {
    local_8 = in_EDI;
    common_chat_templates_inputs::common_chat_templates_inputs
              ((common_chat_templates_inputs *)in_stack_fffffffffffffae0);
    common_chat_msg::common_chat_msg(in_stack_fffffffffffffaf0);
    std::__cxx11::string::operator=(local_160,"user");
    std::__cxx11::string::operator=(local_140,"Hey");
    local_260._8_8_ = local_250;
    common_chat_msg::common_chat_msg(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    local_180 = local_250;
    local_178 = 1;
    __l._M_len = (size_type)in_stack_fffffffffffffb00;
    __l._M_array = in_stack_fffffffffffffaf8;
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator=
              ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)
               in_stack_fffffffffffffaf0,__l);
    local_438 = (undefined1 ***)&local_180;
    do {
      local_438 = local_438 + -0x1a;
      common_chat_msg::~common_chat_msg(in_stack_fffffffffffffae0);
    } while (local_438 != local_250);
    local_2d0 = &local_2c8;
    common_chat_tool::common_chat_tool
              (in_stack_fffffffffffffb00,(common_chat_tool *)in_stack_fffffffffffffaf8);
    local_268 = &local_2c8;
    local_260._M_allocated_capacity = 1;
    __l_00._M_len = (size_type)in_stack_fffffffffffffb00;
    __l_00._M_array = (iterator)in_stack_fffffffffffffaf8;
    std::vector<common_chat_tool,_std::allocator<common_chat_tool>_>::operator=
              ((vector<common_chat_tool,_std::allocator<common_chat_tool>_> *)
               in_stack_fffffffffffffaf0,__l_00);
    local_450 = &local_268;
    do {
      local_450 = local_450 + -0xc;
      common_chat_tool::~common_chat_tool((common_chat_tool *)in_stack_fffffffffffffae0);
    } while ((common_chat_msg_content_part *)local_450 != &local_2c8);
    std::operator<<((ostream *)&std::cout,"| Template | Format |\n");
    std::operator<<((ostream *)&std::cout,"|----------|--------|\n");
    for (local_2d4 = 1; local_2d4 < local_8; local_2d4 = local_2d4 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb20->role,(char *)in_stack_fffffffffffffb18,
                 (allocator<char> *)in_stack_fffffffffffffb10);
      std::allocator<char>::~allocator((allocator<char> *)(local_320 + 0x27));
      lVar1 = std::__cxx11::string::rfind((char *)local_2f8,0x2f7853);
      lVar2 = std::__cxx11::string::size();
      if (lVar1 == lVar2 + -6) {
        read_templates(in_stack_fffffffffffffb78);
        format_00 = (common_chat_format)((ulong)lVar1 >> 0x20);
        in_stack_fffffffffffffb20 = (common_chat_msg *)local_341;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (&in_stack_fffffffffffffb20->role,(char *)in_stack_fffffffffffffb18,
                   (allocator<char> *)in_stack_fffffffffffffb10);
        string_split(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        std::__cxx11::string::~string((string *)(local_341 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_341);
        in_stack_fffffffffffffb18 = (common_chat_msg *)local_320;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffb18);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffb18,sVar4 - 1);
        std::__cxx11::string::string(local_368,(string *)pvVar5);
        std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::get
                  ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
                   in_stack_fffffffffffffae0);
        common_chat_templates_apply
                  (in_stack_fffffffffffffae8,
                   (common_chat_templates_inputs *)in_stack_fffffffffffffae0);
        common_chat_format_name_abi_cxx11_(format_00);
        common_chat_params::~common_chat_params((common_chat_params *)in_stack_fffffffffffffae0);
        in_stack_fffffffffffffb10 = std::operator<<((ostream *)&std::cout,"| ");
        poVar3 = std::operator<<(in_stack_fffffffffffffb10,local_368);
        poVar3 = std::operator<<(poVar3," | ");
        poVar3 = std::operator<<(poVar3,local_388);
        std::operator<<(poVar3," |\n");
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_368);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffaf0);
        std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr
                  ((unique_ptr<common_chat_templates,_common_chat_templates_deleter> *)
                   in_stack_fffffffffffffaf0);
        local_320._32_4_ = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Skipping non-jinja file: ");
        in_stack_fffffffffffffb78 = (string *)std::operator<<(poVar3,local_2f8);
        std::operator<<((ostream *)in_stack_fffffffffffffb78,'\n');
        local_320._32_4_ = 4;
      }
      std::__cxx11::string::~string(local_2f8);
    }
    common_chat_msg::~common_chat_msg(in_stack_fffffffffffffae0);
    common_chat_templates_inputs::~common_chat_templates_inputs
              ((common_chat_templates_inputs *)in_stack_fffffffffffffae0);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv) {
    // try {
#ifndef _WIN32
        if (argc > 1) {
            common_chat_templates_inputs inputs;
            common_chat_msg msg;
            msg.role = "user";
            msg.content = "Hey";
            inputs.messages = {msg};
            inputs.tools = { special_function_tool };

            std::cout << "| Template | Format |\n";
            std::cout << "|----------|--------|\n";

            for (int i = 1; i < argc; i++) {
                try {
                    std::string path = argv[i];
                    if (path.rfind(".jinja") != path.size() - 6) {
                        std::cerr << "Skipping non-jinja file: " << path << '\n';
                        continue;
                    }
                    auto tmpls = read_templates(path);
                    auto parts  = string_split(path, "/");
                    auto name   = parts[parts.size() - 1];
                    auto format = common_chat_format_name(common_chat_templates_apply(tmpls.get(), inputs).format);
                    std::cout << "| " << name << " | " << format << " |\n";
                } catch (const std::exception & e) {
                    std::cerr << "Failed to process " << argv[i] << ": " << e.what() << '\n';
                }
            }
        } else
#endif
        {
            test_msgs_oaicompat_json_conversion();
            test_tools_oaicompat_json_conversion();
            test_template_output_parsers();
            std::cout << "\n[chat] All tests passed!" << '\n';
        }
        return 0;
    // } catch (const std::exception & e) {
    //     std::cerr << "Error: " << e.what() << '\n';
    //     return 1;
    // }
}